

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

void putc_ncr(FILE *ofp,Byte byte)

{
  undefined1 local_11;
  Byte byte_local;
  FILE *ofp_local;
  
  if (running == 0) {
    if (byte == 0x90) {
      running = 1;
    }
    else {
      putc_ncr::prevbyte = byte;
      calccrc(byte);
      if (testing == '\0') {
        write_byte(ofp,byte);
      }
    }
  }
  else {
    local_11 = byte;
    if (byte == '\0') {
      calccrc(0x90);
      if (testing == '\0') {
        write_byte(ofp,0x90);
      }
    }
    else {
      while (local_11 = local_11 + 0xff, local_11 != '\0') {
        calccrc(putc_ncr::prevbyte);
        if (testing == '\0') {
          write_byte(ofp,putc_ncr::prevbyte);
        }
      }
    }
    running = 0;
  }
  return;
}

Assistant:

void
putc_ncr(FILE *ofp, Byte byte)
{
	static Byte prevbyte;

	if (running)
	{
		if (!byte)
		{						/* means write RUNMARK to output */
			calccrc(RUNMARK);
			if (!testing)
				write_byte(ofp, RUNMARK);
		}
		else
		{
			/* BB changed next line */
			/* Borland C++ is `a bit fuzzy' about next line */
			/*  while (--byte) { */
#ifdef __MSDOS__
			while (--byte != 0)
			{
#else
			while (--byte)
			{
#endif
				calccrc(prevbyte);
				if (!testing)
					write_byte(ofp, prevbyte);
			}
		}
		running = 0;
	}
	else if (byte == RUNMARK)
	{
		running++;
	}
	else
	{
		prevbyte = byte;		/* save in case next byte is RUNMARK */
		calccrc(byte);
		if (!testing)
			write_byte(ofp, byte);
	}
}